

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDch(Abc_Ntk_t *pNtk,Dch_Pars_t *pPars)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Gia_Man_t *p;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pAVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_38;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar3 = (Abc_Ntk_t *)0x0;
    pAVar2 = Abc_NtkToDar(pNtk,0,0);
    if (pAVar2 != (Aig_Man_t *)0x0) {
      iVar1 = clock_gettime(3,&local_38);
      if (iVar1 < 0) {
        lVar4 = 1;
      }
      else {
        lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
        lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
      }
      if (pPars->fSynthesis == 0) {
        p = Gia_ManFromAig(pAVar2);
        Aig_ManStop(pAVar2);
      }
      else {
        p = Dar_NewChoiceSynthesis(pAVar2,1,1,pPars->fPower,pPars->fLightSynth,pPars->fVerbose);
      }
      iVar1 = clock_gettime(3,&local_38);
      if (iVar1 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      pPars->timeSynth = lVar5 + lVar4;
      if (pPars->fUseGia == 0) {
        pAig = Gia_ManToAigSkip(p,3);
        Gia_ManStop(p);
        pAVar2 = Dch_ComputeChoices(pAig,pPars);
        Aig_ManStop(pAig);
      }
      else {
        pAVar2 = Cec_ComputeChoices(p,pPars);
      }
      pAVar3 = Abc_NtkFromDarChoices(pNtk,pAVar2);
      Aig_ManStop(pAVar2);
    }
    return pAVar3;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x67c,"Abc_Ntk_t *Abc_NtkDch(Abc_Ntk_t *, Dch_Pars_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDch( Abc_Ntk_t * pNtk, Dch_Pars_t * pPars )
{
    extern Gia_Man_t * Dar_NewChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fLightSynth, int fVerbose );
    extern Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars );

    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig;
    Gia_Man_t * pGia;
    abctime clk;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
clk = Abc_Clock();
    if ( pPars->fSynthesis )
        pGia = Dar_NewChoiceSynthesis( pMan, 1, 1, pPars->fPower, pPars->fLightSynth, pPars->fVerbose );
    else
    {
        pGia = Gia_ManFromAig( pMan );
        Aig_ManStop( pMan );
    }
pPars->timeSynth = Abc_Clock() - clk;
    if ( pPars->fUseGia )
        pMan = Cec_ComputeChoices( pGia, pPars );
    else
    {
        pMan = Gia_ManToAigSkip( pGia, 3 );
        Gia_ManStop( pGia );
        pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
        Aig_ManStop( pTemp );
    }
    pNtkAig = Abc_NtkFromDarChoices( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}